

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

bool __thiscall iDynTree::Model::isJointNameUsed(Model *this,string *jointName)

{
  __type _Var1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  lVar2 = 0;
  do {
    uVar3 = (long)(this->joints).
                  super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->joints).
                  super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    uVar4 = uVar4 + 1;
    if (uVar3 <= uVar4) break;
    _Var1 = std::operator==(jointName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((this->jointNames).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar2));
    lVar2 = lVar2 + 0x20;
  } while (!_Var1);
  return uVar4 < uVar3;
}

Assistant:

bool Model::isJointNameUsed(const std::string jointName) const
{
    for(size_t i=0; i < this->getNrOfJoints(); i++ )
    {
        if( jointName == jointNames[i] )
        {
            return true;
        }
    }

    return false;
}